

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage.cc
# Opt level: O0

void __thiscall
absl::flags_internal::anon_unknown_0::FlagHelpPrettyPrinter::StartLine(FlagHelpPrettyPrinter *this)

{
  ostream *poVar1;
  size_type __n;
  allocator<char> local_31;
  string local_30 [32];
  FlagHelpPrettyPrinter *local_10;
  FlagHelpPrettyPrinter *this_local;
  
  if ((this->first_line_ & 1U) == 0) {
    this->line_len_ = this->min_line_len_ + this->wrapped_line_indent_;
  }
  else {
    this->line_len_ = this->min_line_len_;
    this->first_line_ = false;
  }
  poVar1 = this->out_;
  __n = this->line_len_;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,__n,' ',&local_31);
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void StartLine() {
    if (first_line_) {
      line_len_ = min_line_len_;
      first_line_ = false;
    } else {
      line_len_ = min_line_len_ + wrapped_line_indent_;
    }
    out_ << std::string(line_len_, ' ');
  }